

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O0

void FIX::double_conversion::DoubleToStringConverter::DoubleToAscii
               (double v,DtoaMode mode,int requested_digits,char *buffer,int buffer_length,
               bool *sign,int *length,int *point)

{
  bool bVar1;
  int iVar2;
  BignumDtoaMode BVar3;
  char *pcVar4;
  int *decimal_point;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  BignumDtoaMode bignum_mode;
  bool local_59;
  bool fast_worked;
  Double local_50;
  undefined1 local_48 [8];
  Vector<char> vector;
  int *length_local;
  bool *sign_local;
  int buffer_length_local;
  char *buffer_local;
  int requested_digits_local;
  DtoaMode mode_local;
  double v_local;
  
  vector._8_8_ = length;
  Vector<char>::Vector((Vector<char> *)local_48,buffer,buffer_length);
  Double::Double(&local_50,v);
  bVar1 = Double::IsSpecial(&local_50);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!Double(v).IsSpecial()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x16e,
                  "static void FIX::double_conversion::DoubleToStringConverter::DoubleToAscii(double, DtoaMode, int, char *, int, bool *, int *, int *)"
                 );
  }
  bVar1 = true;
  if ((mode != SHORTEST) && (bVar1 = true, mode != SHORTEST_SINGLE)) {
    bVar1 = -1 < requested_digits;
  }
  if (bVar1) {
    Double::Double((Double *)&stack0xffffffffffffffa8,v);
    iVar2 = Double::Sign((Double *)&stack0xffffffffffffffa8);
    if (iVar2 < 0) {
      *sign = true;
      _requested_digits_local = -v;
    }
    else {
      *sign = false;
      _requested_digits_local = v;
    }
    if ((mode == PRECISION) && (requested_digits == 0)) {
      pcVar4 = Vector<char>::operator[]((Vector<char> *)local_48,0);
      *pcVar4 = '\0';
      *(undefined4 *)vector._8_8_ = 0;
    }
    else if ((_requested_digits_local != 0.0) || (NAN(_requested_digits_local))) {
      decimal_point = (int *)(ulong)mode;
      switch(decimal_point) {
      case (int *)0x0:
        buffer_00.start_ = (char *)((ulong)vector.start_ & 0xffffffff);
        buffer_00.length_ = vector.length_;
        buffer_00._12_4_ = vector._12_4_;
        local_59 = FastDtoa((double_conversion *)0x0,_requested_digits_local,FAST_DTOA_SHORTEST,
                            local_48._0_4_,buffer_00,point,decimal_point);
        break;
      case (int *)0x1:
        buffer_01.start_ = (char *)((ulong)vector.start_ & 0xffffffff);
        buffer_01.length_ = vector.length_;
        buffer_01._12_4_ = vector._12_4_;
        local_59 = FastDtoa((double_conversion *)0x1,_requested_digits_local,FAST_DTOA_SHORTEST,
                            local_48._0_4_,buffer_01,point,decimal_point);
        break;
      case (int *)0x2:
        buffer_04.start_ = (char *)((ulong)vector.start_ & 0xffffffff);
        buffer_04.length_ = vector.length_;
        buffer_04._12_4_ = vector._12_4_;
        local_59 = FastFixedDtoa((double_conversion *)(ulong)(uint)requested_digits,
                                 _requested_digits_local,local_48._0_4_,buffer_04,point,length);
        break;
      case (int *)0x3:
        buffer_02.start_ = (char *)((ulong)vector.start_ & 0xffffffff);
        buffer_02.length_ = vector.length_;
        buffer_02._12_4_ = vector._12_4_;
        local_59 = FastDtoa((double_conversion *)0x2,_requested_digits_local,requested_digits,
                            local_48._0_4_,buffer_02,point,decimal_point);
        break;
      default:
        abort();
      }
      if (local_59 == false) {
        BVar3 = DtoaToBignumDtoaMode(mode);
        buffer_03.start_ = (char *)((ulong)vector.start_ & 0xffffffff);
        buffer_03.length_ = vector.length_;
        buffer_03._12_4_ = vector._12_4_;
        BignumDtoa((double_conversion *)(ulong)BVar3,_requested_digits_local,requested_digits,
                   local_48._0_4_,buffer_03,point,decimal_point);
        pcVar4 = Vector<char>::operator[]((Vector<char> *)local_48,*(int *)vector._8_8_);
        *pcVar4 = '\0';
      }
    }
    else {
      pcVar4 = Vector<char>::operator[]((Vector<char> *)local_48,0);
      *pcVar4 = '0';
      pcVar4 = Vector<char>::operator[]((Vector<char> *)local_48,1);
      *pcVar4 = '\0';
      *(undefined4 *)vector._8_8_ = 1;
      *point = 1;
    }
    return;
  }
  __assert_fail("mode == SHORTEST || mode == SHORTEST_SINGLE || requested_digits >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                ,0x16f,
                "static void FIX::double_conversion::DoubleToStringConverter::DoubleToAscii(double, DtoaMode, int, char *, int, bool *, int *, int *)"
               );
}

Assistant:

void DoubleToStringConverter::DoubleToAscii(double v,
                                            DtoaMode mode,
                                            int requested_digits,
                                            char* buffer,
                                            int buffer_length,
                                            bool* sign,
                                            int* length,
                                            int* point) {
  Vector<char> vector(buffer, buffer_length);
  ASSERT(!Double(v).IsSpecial());
  ASSERT(mode == SHORTEST || mode == SHORTEST_SINGLE || requested_digits >= 0);

  if (Double(v).Sign() < 0) {
    *sign = true;
    v = -v;
  } else {
    *sign = false;
  }

  if (mode == PRECISION && requested_digits == 0) {
    vector[0] = '\0';
    *length = 0;
    return;
  }

  if (v == 0) {
    vector[0] = '0';
    vector[1] = '\0';
    *length = 1;
    *point = 1;
    return;
  }

  bool fast_worked;
  switch (mode) {
    case SHORTEST:
      fast_worked = FastDtoa(v, FAST_DTOA_SHORTEST, 0, vector, length, point);
      break;
    case SHORTEST_SINGLE:
      fast_worked = FastDtoa(v, FAST_DTOA_SHORTEST_SINGLE, 0,
                             vector, length, point);
      break;
    case FIXED:
      fast_worked = FastFixedDtoa(v, requested_digits, vector, length, point);
      break;
    case PRECISION:
      fast_worked = FastDtoa(v, FAST_DTOA_PRECISION, requested_digits,
                             vector, length, point);
      break;
    default:
      fast_worked = false;
      UNREACHABLE();
  }
  if (fast_worked) return;

  // If the fast dtoa didn't succeed use the slower bignum version.
  BignumDtoaMode bignum_mode = DtoaToBignumDtoaMode(mode);
  BignumDtoa(v, bignum_mode, requested_digits, vector, length, point);
  vector[*length] = '\0';
}